

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O1

LongNameHandler *
icu_63::number::impl::LongNameHandler::forMeasureUnit
          (Locale *loc,MeasureUnit *unitRef,MeasureUnit *perUnit,UNumberUnitWidth *width,
          PluralRules *rules,MicroPropsGenerator *parent,UErrorCode *status)

{
  bool bVar1;
  int iVar2;
  char *__s1;
  long lVar3;
  char *unit_00;
  bool isResolved;
  MeasureUnit unit;
  MeasureUnit resolved;
  bool local_251;
  undefined1 local_250 [24];
  UnicodeString local_238 [8];
  
  MeasureUnit::MeasureUnit((MeasureUnit *)local_250,unitRef);
  __s1 = MeasureUnit::getType(perUnit);
  unit_00 = "none";
  iVar2 = strcmp(__s1,"none");
  if (iVar2 != 0) {
    local_251 = false;
    MeasureUnit::resolveUnitPerUnit
              ((MeasureUnit *)local_238,(MeasureUnit *)local_250,perUnit,&local_251);
    bVar1 = local_251;
    if (local_251 == true) {
      unit_00 = (char *)local_238;
      MeasureUnit::operator=((MeasureUnit *)local_250,(MeasureUnit *)unit_00);
    }
    else {
      unit_00 = local_250;
      perUnit = (MeasureUnit *)
                forCompoundUnit(loc,(MeasureUnit *)unit_00,perUnit,width,rules,parent,status);
    }
    MeasureUnit::~MeasureUnit((MeasureUnit *)local_238);
    if (bVar1 == false) goto LAB_002a6f8f;
  }
  perUnit = (MeasureUnit *)UMemory::operator_new((UMemory *)0x2c0,(size_t)unit_00);
  if ((LongNameHandler *)perUnit == (LongNameHandler *)0x0) {
    perUnit = (MeasureUnit *)0x0;
  }
  else {
    LongNameHandler((LongNameHandler *)perUnit,rules,parent);
  }
  if ((LongNameHandler *)perUnit == (LongNameHandler *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    perUnit = (MeasureUnit *)0x0;
  }
  else {
    lVar3 = 0;
    do {
      *(undefined ***)((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar3) =
           &PTR__UnicodeString_0048be70;
      *(undefined2 *)((long)&local_238[0].fUnion + lVar3) = 2;
      lVar3 = lVar3 + 0x40;
    } while (lVar3 != 0x200);
    anon_unknown.dwarf_1b0bd1::getMeasureData(loc,(MeasureUnit *)local_250,width,local_238,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      simpleFormatsToModifiers((LongNameHandler *)perUnit,local_238,UNUM_FIELD_COUNT,status);
    }
    lVar3 = 0x1c0;
    do {
      icu_63::UnicodeString::~UnicodeString
                ((UnicodeString *)
                 ((long)&local_238[0].super_Replaceable.super_UObject._vptr_UObject + lVar3));
      lVar3 = lVar3 + -0x40;
    } while (lVar3 != -0x40);
  }
LAB_002a6f8f:
  MeasureUnit::~MeasureUnit((MeasureUnit *)local_250);
  return (LongNameHandler *)perUnit;
}

Assistant:

LongNameHandler*
LongNameHandler::forMeasureUnit(const Locale &loc, const MeasureUnit &unitRef, const MeasureUnit &perUnit,
                                const UNumberUnitWidth &width, const PluralRules *rules,
                                const MicroPropsGenerator *parent, UErrorCode &status) {
    MeasureUnit unit = unitRef;
    if (uprv_strcmp(perUnit.getType(), "none") != 0) {
        // Compound unit: first try to simplify (e.g., meters per second is its own unit).
        bool isResolved = false;
        MeasureUnit resolved = MeasureUnit::resolveUnitPerUnit(unit, perUnit, &isResolved);
        if (isResolved) {
            unit = resolved;
        } else {
            // No simplified form is available.
            return forCompoundUnit(loc, unit, perUnit, width, rules, parent, status);
        }
    }

    auto* result = new LongNameHandler(rules, parent);
    if (result == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    UnicodeString simpleFormats[ARRAY_LENGTH];
    getMeasureData(loc, unit, width, simpleFormats, status);
    if (U_FAILURE(status)) { return result; }
    // TODO: What field to use for units?
    result->simpleFormatsToModifiers(simpleFormats, UNUM_FIELD_COUNT, status);
    return result;
}